

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O1

void __thiscall
cmMessenger::DisplayMessage
          (cmMessenger *this,MessageType t,string *text,cmListFileBacktrace *backtrace)

{
  cmDebuggerAdapter *this_00;
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 uVar7;
  cmListFileContext *pcVar8;
  ostream *poVar9;
  long *plVar10;
  cmListFileBacktrace *pcVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  long lVar13;
  char *pcVar14;
  basic_string_view<char,_std::char_traits<char>_> __str;
  cmMessageMetadata md;
  cmListFileContext lfc;
  ostringstream msg;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_270;
  cmMessenger *local_260;
  string local_258;
  undefined1 local_238 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  long local_1f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1f0;
  bool local_1d0;
  element_type **local_1c8 [2];
  element_type *local_1b8 [2];
  undefined1 local_1a8 [376];
  
  uVar1 = (ulong)t;
  pcVar11 = backtrace;
  local_260 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (t < (DEPRECATION_WARNING|AUTHOR_ERROR)) {
    pcVar14 = &DAT_008358dc + *(int *)(&DAT_008358dc + uVar1 * 4);
    pcVar11 = (cmListFileBacktrace *)&DAT_00835900;
    lVar13 = *(long *)(&DAT_00835900 + uVar1 * 8);
  }
  else {
    lVar13 = 0xd;
    pcVar14 = "CMake Warning";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,lVar13);
  PrintBacktraceTitle(local_260,(ostream *)local_1a8,backtrace);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":\n",2);
  local_238._0_8_ = (element_type *)0x4d;
  local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  cmDocumentationFormatter::PrintFormatted
            ((cmDocumentationFormatter *)local_238,(ostream *)local_1a8,text);
  local_270.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (backtrace->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_270.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (backtrace->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_270.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pcVar11 = (cmListFileBacktrace *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_270.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_270.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_270.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_270.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  bVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty(&local_270);
  iVar6 = (int)pcVar11;
  if (!bVar4) {
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_238);
    uVar3 = local_238._8_8_;
    local_270.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_238._0_8_;
    _Var2._M_pi = local_270.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    local_238._0_8_ = (element_type *)0x0;
    local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_270.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
    if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    bVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty(&local_270);
    iVar6 = (int)pcVar11;
    if (!bVar4) {
      bVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty(&local_270);
      iVar6 = (int)pcVar11;
      if (!bVar4) {
        bVar4 = true;
        do {
          pcVar8 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top(&local_270);
          cmListFileContext::cmListFileContext((cmListFileContext *)local_238,pcVar8);
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) || (local_1f8 == -1)) {
            if (bVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Call Stack (most recent call first):\n",0x25);
              bVar4 = false;
            }
            if ((local_260->TopSource).
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged == true) {
              cmSystemTools::RelativeIfUnder(&local_258,(string *)local_260,(string *)&local_218);
              std::__cxx11::string::operator=((string *)local_218._M_local_buf,(string *)&local_258)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                operator_delete(local_258._M_dataplus._M_p,
                                local_258.field_2._M_allocated_capacity + 1);
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
            poVar9 = operator<<((ostream *)local_1a8,(cmListFileContext *)local_238);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          }
          if (local_1d0 == true) {
            local_1d0 = false;
            if (local_1f0._M_value._M_dataplus._M_p !=
                (_Alloc_hider)((long)&local_1f0._M_value + 0x10)) {
              operator_delete((void *)local_1f0._M_value._M_dataplus._M_p,local_1f0._16_8_ + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_allocated_capacity != &local_208) {
            operator_delete((void *)local_218._M_allocated_capacity,
                            local_208._M_allocated_capacity + 1);
          }
          if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
            operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
          }
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_238);
          uVar3 = local_238._8_8_;
          local_270.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)local_238._0_8_;
          _Var2._M_pi = local_270.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_238._0_8_ = (element_type *)0x0;
          local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_270.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
          if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
          }
          bVar5 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty(&local_270);
          iVar6 = (int)pcVar11;
        } while (!bVar5);
      }
    }
  }
  if (local_270.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (t == AUTHOR_WARNING) {
    lVar13 = 0x45;
    pcVar14 = "This warning is for project developers.  Use -Wno-dev to suppress it.";
  }
  else {
    if (t != AUTHOR_ERROR) goto LAB_002a0485;
    lVar13 = 0x48;
    pcVar14 = "This error is for project developers. Use -Wno-error=dev to suppress it.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,lVar13);
LAB_002a0485:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  if (t == INTERNAL_ERROR) {
    cmsys::SystemInformation::GetProgramStack_abi_cxx11_
              ((string *)local_238,(SystemInformation *)0x0,0,iVar6);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_258._M_dataplus._M_p = (pointer)local_238._8_8_;
      local_258._M_string_length = local_238._0_8_;
      __str._M_str = "WARNING:";
      __str._M_len = 8;
      iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_258,0,8,__str);
      if (iVar6 == 0) {
        std::__cxx11::string::substr((ulong)local_1c8,(ulong)local_238);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x835ab3);
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar10 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar10 == p_Var12) {
          local_258.field_2._M_allocated_capacity = (size_type)p_Var12->_vptr__Sp_counted_base;
          local_258.field_2._8_8_ = plVar10[3];
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        }
        else {
          local_258.field_2._M_allocated_capacity = (size_type)p_Var12->_vptr__Sp_counted_base;
          local_258._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_258._M_string_length = plVar10[1];
        *plVar10 = (long)p_Var12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_238,(string *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],
                          (ulong)((long)&(local_1b8[0]->Value).Name._M_dataplus._M_p + 1));
        }
      }
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_238._0_8_,local_238._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    }
    if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
  }
  uVar7 = 0;
  if (t < LOG) {
    uVar7 = *(undefined4 *)(&DAT_008358c4 + uVar1 * 4);
  }
  local_258._M_string_length = CONCAT44((int)(local_258._M_string_length >> 0x20),uVar7);
  if ((t < DEPRECATION_WARNING) && ((0x8eU >> (t & 0x1f) & 1) != 0)) {
    cmSystemTools::s_ErrorOccurred = true;
    local_258._M_dataplus._M_p = "Error";
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((string *)local_238,(cmMessageMetadata *)&local_258);
  }
  else {
    local_258._M_dataplus._M_p = "Warning";
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((string *)local_238,(cmMessageMetadata *)&local_258);
  }
  if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  this_00 = (local_260->DebuggerAdapter).
            super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (cmDebuggerAdapter *)0x0) {
    std::__cxx11::stringbuf::str();
    cmDebugger::cmDebuggerAdapter::OnMessageOutput(this_00,t,(string *)local_238);
    if ((element_type *)local_238._0_8_ != (element_type *)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void cmMessenger::DisplayMessage(MessageType t, const std::string& text,
                                 const cmListFileBacktrace& backtrace) const
{
  std::ostringstream msg;
  if (!printMessagePreamble(t, msg)) {
    return;
  }

  // Add the immediate context.
  this->PrintBacktraceTitle(msg, backtrace);

  printMessageText(msg, text);

  // Add the rest of the context.
  PrintCallStack(msg, backtrace, this->TopSource);

  displayMessage(t, msg);

#ifdef CMake_ENABLE_DEBUGGER
  if (DebuggerAdapter != nullptr) {
    DebuggerAdapter->OnMessageOutput(t, msg.str());
  }
#endif
}